

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IStringReader.cpp
# Opt level: O0

void __thiscall IStringReader::getWord(IStringReader *this,string *str)

{
  bool bVar1;
  streamoff sVar2;
  undefined1 auVar3 [16];
  string local_80 [36];
  int local_5c;
  undefined1 auStack_58 [4];
  int temp;
  undefined8 local_50;
  undefined4 local_44;
  string local_40 [4];
  int temp_pos;
  undefined4 local_20;
  char local_19;
  int base_len;
  char tempChar;
  string *str_local;
  IStringReader *this_local;
  
  _base_len = str;
  str_local = (string *)this;
  local_20 = std::__cxx11::string::length();
  local_19 = std::istream::get();
  if ((local_19 != -1) && (bVar1 = IDictionary::isQuotation2(local_19), bVar1)) {
    std::__cxx11::string::operator+=((string *)_base_len,local_19);
    while( true ) {
      local_19 = std::istream::get();
      if (local_19 == -1) break;
      bVar1 = IDictionary::isQuotation2(local_19);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)_base_len,local_19);
        return;
      }
      bVar1 = IDictionary::isQuotation1(local_19);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_40,(ulong)_base_len);
        std::__cxx11::string::operator=((string *)_base_len,local_40);
        std::__cxx11::string::~string(local_40);
        std::operator<<((ostream *)&std::cerr,"string_error");
      }
      else {
        bVar1 = IDictionary::isSlash(local_19);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)_base_len,local_19);
          auVar3 = std::istream::tellg();
          _auStack_58 = auVar3;
          sVar2 = std::fpos::operator_cast_to_long((fpos *)auStack_58);
          local_44 = (undefined4)sVar2;
          local_5c = ICharReader::readSpecialChar((this->super_IAbstractReader).m_ifs,_base_len);
          if (local_5c == 0) {
            std::__cxx11::string::substr((ulong)local_80,(ulong)_base_len);
            std::__cxx11::string::operator=((string *)_base_len,local_80);
            std::__cxx11::string::~string(local_80);
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)_base_len,local_19);
        }
      }
    }
  }
  return;
}

Assistant:

void IStringReader::getWord(std::string &str) {
    char tempChar;
    int base_len=str.length();

    if((tempChar=m_ifs->get())!=EOF)
    {
        if(IDictionary::isQuotation2(tempChar))
        {
            str+=tempChar;
            while((tempChar=m_ifs->get())!=EOF)
            {
                if(IDictionary::isQuotation2(tempChar))
                {
                    str+=tempChar;
                    break;
                }
                else if(IDictionary::isQuotation1(tempChar))
                {
                    str=str.substr(0,base_len);

                    std::cerr<<"string_error";
                }
                else if(IDictionary::isSlash(tempChar))
                {
                    str+=tempChar;

                    int temp_pos=m_ifs->tellg();
                    int temp=ICharReader::readSpecialChar(m_ifs,str);
                    if(!temp)
                    {
                        str=str.substr(0,base_len);
                    }
                }
                else
                {
                    str+=tempChar;
                }
            }
        }
    }
}